

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRImageFromFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  reference __ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  char *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  char **in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  uchar *in_stack_ffffffffffffff08;
  EXRHeader *in_stack_ffffffffffffff10;
  EXRImage *in_stack_ffffffffffffff18;
  string local_d8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b8;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  FILE *local_68;
  allocator local_49;
  string local_48 [40];
  char *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  int local_4;
  
  if (in_RDI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Invalid argument for LoadEXRImageFromFile",&local_49);
    tinyexr::SetErrorMessage
              (in_stack_fffffffffffffe80,
               (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4 = -3;
  }
  else {
    local_68 = (FILE *)0x0;
    local_20 = in_RDX;
    local_10 = in_RDI;
    local_68 = fopen(in_RDX,"rb");
    if (local_68 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,local_20,&local_a9);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      tinyexr::SetErrorMessage
                (in_stack_fffffffffffffe80,
                 (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      local_4 = -7;
    }
    else {
      fseek(local_68,0,2);
      local_b8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ftell(local_68);
      fseek(local_68,0,0);
      if (local_b8 < (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff08,local_20,(allocator *)&stack0xffffffffffffff07
                  );
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        tinyexr::SetErrorMessage
                  (in_stack_fffffffffffffe80,
                   (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
        local_4 = -5;
      }
      else {
        pvVar1 = local_b8;
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x43d67d);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (pvVar1,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x43d69d);
        __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &stack0xfffffffffffffee8,0);
        fread(__ptr,1,(size_t)local_b8,local_68);
        fclose(local_68);
        pvVar1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (local_10,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_4 = LoadEXRImageFromMemory
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar1);
      }
    }
  }
  return local_4;
}

Assistant:

int LoadEXRImageFromFile(EXRImage *exr_image, const EXRHeader *exr_header,
                         const char *filename, const char **err) {
  if (exr_image == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    // TODO(syoyo): return wfopen_s erro code
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  if (filesize < 16) {
    tinyexr::SetErrorMessage("File size too short " + std::string(filename),
                             err);
    return TINYEXR_ERROR_INVALID_FILE;
  }

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRImageFromMemory(exr_image, exr_header, &buf.at(0), filesize,
                                err);
}